

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestForeignNested::~TestForeignNested(TestForeignNested *this)

{
  ~TestForeignNested(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestForeignNested::~TestForeignNested() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestForeignNested)
  SharedDtor(*this);
}